

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBhash.h
# Opt level: O2

void __thiscall bwtil::DBhash::initAuxHash(DBhash *this)

{
  packed_view_t *this_00;
  size_t size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  value_type vVar4;
  ostream *poVar5;
  value_type vVar6;
  value_type v;
  ulong uVar7;
  size_t width;
  ulong v_00;
  ulint i;
  pointer puVar8;
  pointer index;
  ulong uVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  pair<unsigned_long,_unsigned_long> pVar11;
  packed_view<std::vector> local_68;
  IndexedBWT *local_38;
  undefined1 extraout_var [56];
  
  size = this->auxiliary_hash_size;
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->n + 1);
  auVar10._0_8_ = log2(auVar2._0_8_);
  auVar10._8_56_ = extraout_var;
  auVar2 = vroundsd_avx(auVar10._0_16_,auVar10._0_16_,10);
  width = vcvttsd2usi_avx512f(auVar2);
  bv::internal::packed_view<std::vector>::packed_view(&local_68,width,size);
  this_00 = &this->auxiliary_hash;
  bv::internal::packed_view<std::vector>::operator=(this_00,&local_68);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68);
  local_38 = &this->indexedBWT;
  vVar4 = this->text_fingerprint_length + 1;
  uVar9 = 0xffffffffffffffff;
  uVar7 = 0;
  for (puVar8 = (pointer)0x0; puVar8 < (pointer)this->auxiliary_hash_size;
      puVar8 = (pointer)((long)puVar8 + 1)) {
    pVar11 = IndexedBWT::BS(local_38,(ulint)puVar8,this->w_aux,
                            (pair<unsigned_long,_unsigned_long>)ZEXT816(0));
    v_00 = vVar4;
    if (pVar11.first < pVar11.second) {
      v_00 = pVar11.first;
    }
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar8;
    bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
              ((item_reference<bv::internal::packed_view<std::vector>_> *)&local_68,v_00);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->auxiliary_hash_size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    iVar3 = SUB164(auVar1 / auVar2,0);
    if (((int)uVar9 < iVar3) && (iVar3 % 10 == 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout,"   ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      poVar5 = std::operator<<(poVar5,"% done.");
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar9 = SUB168(auVar1 / auVar2,0) & 0xffffffff;
    }
    uVar7 = uVar7 + 100;
  }
  local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)this->auxiliary_hash_size - 1);
  local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  vVar6 = bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::value
                    ((item_reference<bv::internal::packed_view<std::vector>_> *)&local_68);
  if (vVar6 == vVar4) {
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(this->auxiliary_hash_size - 1);
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
              ((item_reference<bv::internal::packed_view<std::vector>_> *)&local_68,
               this->text_fingerprint_length);
  }
  puVar8 = (pointer)(this->auxiliary_hash_size - 1);
  while (index = puVar8, index != (pointer)0x0) {
    puVar8 = (pointer)((long)index - 1);
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar8;
    vVar6 = bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::value
                      ((item_reference<bv::internal::packed_view<std::vector>_> *)&local_68);
    if (vVar6 == vVar4) {
      v = bv::internal::packed_view<std::vector>::get(this_00,(size_t)index);
      local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      local_68._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar8;
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)&local_68,v);
    }
  }
  return;
}

Assistant:

void initAuxHash(){

		auxiliary_hash =  packed_view_t(ceil(log2(n+1)),auxiliary_hash_size);

		ulint empty = text_fingerprint_length+1;

		int perc,last_perc=-1;

		for (ulint i = 0; i < auxiliary_hash_size; i++){

			pair<ulint,ulint> interval = indexedBWT.BS(i,w_aux);

			if(interval.second>interval.first)
				auxiliary_hash[i] = interval.first;
			else
				auxiliary_hash[i] = empty;

			perc = (100*i)/auxiliary_hash_size;
			if(perc>last_perc and perc%10==0){

				cout << "   " <<  perc << "% done." << endl;
				last_perc=perc;

			}

		}

		if (auxiliary_hash[auxiliary_hash_size-1] == empty)
			auxiliary_hash[auxiliary_hash_size-1] = text_fingerprint_length;

		for (ulint i = auxiliary_hash_size - 1; i >= 1; i--) {

			if (auxiliary_hash[i-1] == empty)
				auxiliary_hash[i-1] = auxiliary_hash.get(i);

		}

	}